

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O0

void __thiscall Dialog::BuildPacket(Dialog *this,PacketBuilder *builder)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  reference ppVar4;
  undefined1 local_d0 [8];
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  link;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> page;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  PacketBuilder *builder_local;
  Dialog *this_local;
  
  iVar2 = PacketLength(this);
  PacketBuilder::ReserveMore(builder,(long)iVar2);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((const_iterator *)&__end1._M_node,&this->pages);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((const_iterator *)((long)&page.field_2 + 8),&this->pages);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)((long)&page.field_2 + 8));
    if (!bVar1) break;
    pbVar3 = std::
             _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)&__end1._M_node);
    std::__cxx11::string::string((string *)local_80,(string *)pbVar3);
    PacketBuilder::AddShort(builder,1);
    PacketBuilder::AddBreakString(builder,(string *)local_80,0xff);
    std::__cxx11::string::~string((string *)local_80);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&__end1._M_node);
  }
  __end1_1 = std::
             multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->links);
  link.second.field_2._8_8_ =
       std::
       multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->links);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)((long)&link.second.field_2 + 8));
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_d0,ppVar4);
    PacketBuilder::AddShort(builder,2);
    PacketBuilder::AddShort(builder,local_d0._0_4_);
    PacketBuilder::AddBreakString(builder,(string *)&link,0xff);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void Dialog::BuildPacket(PacketBuilder& builder) const
{
	builder.ReserveMore(this->PacketLength());

	UTIL_FOREACH(this->pages, page)
	{
		builder.AddShort(DIALOG_TEXT);
		builder.AddBreakString(page);
	}

	UTIL_FOREACH(this->links, link)
	{
		builder.AddShort(DIALOG_LINK);
		builder.AddShort(link.first);
		builder.AddBreakString(link.second);
	}
}